

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint _h;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int *piVar19;
  uint uVar20;
  int iVar21;
  undefined1 (*pauVar22) [16];
  undefined8 *puVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  undefined8 *puVar29;
  uint uVar30;
  undefined1 (*pauVar31) [16];
  byte bVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  undefined1 (*pauVar39) [32];
  int q;
  ulong uVar40;
  long lVar41;
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 local_108 [64];
  size_t local_c8;
  Mat *local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  auVar44 = local_98;
  uVar2 = bottom_im2col->w;
  uVar27 = (ulong)(int)uVar2;
  uVar24 = bottom_im2col->h;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = uVar24;
  _h = bottom_im2col->c;
  local_98._4_4_ = 0;
  local_98._0_4_ = top_blob->c;
  local_98._8_24_ = auVar44._8_24_;
  local_c8 = 0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_4_ = 0;
  local_108._12_4_ = 0;
  local_108._16_8_ = 0;
  local_108._24_4_ = 0;
  local_108._32_8_ = (Allocator *)0x0;
  local_108._40_4_ = 0;
  local_108._44_4_ = 0;
  local_108._48_12_ = SUB1612((undefined1  [16])0x0,4);
  if ((long)uVar27 < 4) {
    uVar20 = uVar2;
    uVar30 = uVar24;
    if (1 < (int)uVar2) {
      uVar30 = uVar24 * 2;
      uVar20 = (uVar2 & 1) + 1;
    }
  }
  else {
    uVar20 = (uVar2 & 1) + (uVar2 >> 2) + (uint)((uVar2 >> 1 & 1) != 0);
    uVar30 = uVar24 * 4;
  }
  local_c0 = top_blob;
  Mat::create((Mat *)local_108,uVar30,_h,uVar20,8,8,opt->workspace_allocator);
  uVar25 = 0;
  uVar20 = 0;
  if (0 < (int)uVar24) {
    uVar20 = uVar24;
  }
  uVar36 = 0;
  if (0 < (int)_h) {
    uVar36 = (ulong)_h;
  }
  uVar26 = (ulong)(uint)((int)uVar2 >> 2);
  if ((int)uVar2 >> 2 < 1) {
    uVar26 = uVar25;
  }
  for (uVar33 = 0; uVar33 != uVar26; uVar33 = uVar33 + 1) {
    pauVar39 = (undefined1 (*) [32])(local_c8 * uVar33 * local_108._16_8_ + local_108._0_8_);
    for (uVar40 = 0; uVar40 != uVar36; uVar40 = uVar40 + 1) {
      pauVar28 = (undefined1 (*) [32])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar40 + uVar25);
      uVar30 = uVar20;
      while (bVar42 = uVar30 != 0, uVar30 = uVar30 - 1, bVar42) {
        *pauVar39 = *pauVar28;
        pauVar39 = pauVar39 + 1;
        pauVar28 = (undefined1 (*) [32])(*pauVar28 + uVar27 * 8);
      }
    }
    uVar25 = uVar25 + 0x20;
  }
  uVar30 = uVar2 >> 1 & 1;
  lVar41 = (uVar27 & 0xfffffffffffffffc) << 3;
  for (uVar25 = 0; iVar21 = (int)(uVar27 & 0xfffffffffffffffc), uVar25 != uVar30;
      uVar25 = uVar25 + 1) {
    iVar21 = iVar21 + (int)uVar25 * 2;
    pauVar22 = (undefined1 (*) [16])
               ((long)((iVar21 % 4 >> 1) + iVar21 / 4) * local_c8 * local_108._16_8_ +
               local_108._0_8_);
    for (uVar26 = 0; uVar26 != uVar36; uVar26 = uVar26 + 1) {
      pauVar31 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar41);
      uVar34 = uVar20;
      while (bVar42 = uVar34 != 0, uVar34 = uVar34 - 1, bVar42) {
        *pauVar22 = *pauVar31;
        pauVar22 = pauVar22 + 1;
        pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar27 * 8);
      }
    }
    lVar41 = lVar41 + 0x10;
  }
  uVar25 = (ulong)(int)(iVar21 + uVar30 * 2);
  lVar41 = uVar25 * 8;
  for (; (long)uVar25 < (long)uVar27; uVar25 = uVar25 + 1) {
    uVar30 = (int)uVar25 >> 0x1f;
    uVar26 = (ulong)uVar30 << 0x20 | uVar25 & 0xffffffff;
    puVar23 = (undefined8 *)
              ((long)((int)((long)((ulong)uVar30 << 0x20 | uVar25 & 0xffffffff) % 2) +
                      (int)((long)uVar26 / 4) + (int)(char)((char)((long)uVar26 % 4) / '\x02')) *
               local_c8 * local_108._16_8_ + local_108._0_8_);
    pvVar3 = bottom_im2col->data;
    for (uVar26 = 0; uVar26 != uVar36; uVar26 = uVar26 + 1) {
      puVar29 = (undefined8 *)
                ((long)pvVar3 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 + lVar41);
      uVar30 = uVar20;
      while (bVar42 = uVar30 != 0, uVar30 = uVar30 - 1, bVar42) {
        *puVar23 = *puVar29;
        puVar23 = puVar23 + 1;
        puVar29 = puVar29 + uVar27;
      }
    }
    lVar41 = lVar41 + 8;
  }
  uVar36 = 0;
  uVar25 = (ulong)(_h * uVar24);
  if ((int)(_h * uVar24) < 1) {
    uVar25 = uVar36;
  }
  uVar26 = local_98._0_8_ & 0xffffffff;
  if (local_98._0_4_ < 1) {
    uVar26 = uVar36;
  }
  for (; uVar36 != uVar26; uVar36 = uVar36 + 1) {
    pauVar39 = (undefined1 (*) [32])
               (local_c0->cstep * uVar36 * local_c0->elemsize + (long)local_c0->data);
    lVar41 = 0;
    for (uVar33 = 0; (long)(uVar33 | 3) < (long)uVar27; uVar33 = uVar33 + 4) {
      lVar35 = kernel->cstep * uVar36 * kernel->elemsize;
      lVar37 = local_c8 * local_108._16_8_ * lVar41;
      local_98 = ZEXT1632(ZEXT816(0));
      lVar38 = 0;
      auVar49 = ZEXT1664((undefined1  [16])0x0);
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      local_b8 = ZEXT1632(ZEXT816(0));
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      auVar52 = ZEXT1664((undefined1  [16])0x0);
      auVar54 = ZEXT1664((undefined1  [16])0x0);
      uVar40 = uVar25;
      while( true ) {
        iVar21 = (int)uVar40;
        uVar40 = (ulong)(iVar21 - 1);
        auVar51 = auVar52._0_32_;
        auVar53 = auVar54._0_32_;
        auVar43 = auVar50._0_32_;
        auVar44 = auVar45._0_32_;
        auVar46 = auVar47._0_32_;
        auVar48 = auVar49._0_32_;
        if (iVar21 == 0) break;
        auVar8 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_108._0_8_ + lVar38 + lVar37));
        auVar9 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar38 + lVar35));
        auVar13 = vpmullw_avx2(auVar9,auVar8);
        auVar10 = vpmulhw_avx2(auVar8,auVar9);
        auVar18 = vpermq_avx2(auVar8,0x4e);
        auVar14 = vpmullw_avx2(auVar9,auVar18);
        auVar11 = vpmulhw_avx2(auVar9,auVar18);
        auVar17 = vpunpcklwd_avx2(auVar13,auVar10);
        auVar53 = vpaddd_avx2(auVar53,auVar17);
        auVar17 = vpunpcklwd_avx2(auVar14,auVar11);
        auVar51 = vpaddd_avx2(auVar51,auVar17);
        auVar17 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar38 + lVar35 + 0x10)
                                );
        auVar15 = vpmullw_avx2(auVar8,auVar17);
        auVar12 = vpmulhw_avx2(auVar8,auVar17);
        auVar8 = vpunpcklwd_avx2(auVar15,auVar12);
        auVar43 = vpaddd_avx2(auVar43,auVar8);
        auVar16 = vpmullw_avx2(auVar18,auVar17);
        auVar18 = vpmulhw_avx2(auVar18,auVar17);
        auVar8 = vpunpcklwd_avx2(auVar16,auVar18);
        auVar8 = vpaddd_avx2(auVar8,local_b8);
        auVar10 = vpunpckhwd_avx2(auVar13,auVar10);
        auVar53 = vpaddd_avx2(auVar10,auVar53);
        auVar54 = ZEXT3264(auVar53);
        auVar53 = vpunpckhwd_avx2(auVar14,auVar11);
        auVar51 = vpaddd_avx2(auVar51,auVar53);
        auVar52 = ZEXT3264(auVar51);
        auVar51 = vpunpckhwd_avx2(auVar15,auVar12);
        auVar43 = vpaddd_avx2(auVar43,auVar51);
        auVar50 = ZEXT3264(auVar43);
        auVar43 = vpunpckhwd_avx2(auVar16,auVar18);
        local_b8 = vpaddd_avx2(auVar8,auVar43);
        auVar43 = vpmovsxbw_avx2(*(undefined1 (*) [16])(local_108._0_8_ + lVar38 + lVar37 + 0x10));
        auVar11 = vpmullw_avx2(auVar9,auVar43);
        auVar8 = vpmulhw_avx2(auVar9,auVar43);
        auVar51 = vpermq_avx2(auVar43,0x4e);
        auVar12 = vpmullw_avx2(auVar9,auVar51);
        auVar9 = vpmulhw_avx2(auVar9,auVar51);
        auVar18 = vpmullw_avx2(auVar43,auVar17);
        auVar10 = vpmulhw_avx2(auVar43,auVar17);
        auVar13 = vpmullw_avx2(auVar51,auVar17);
        auVar17 = vpmulhw_avx2(auVar51,auVar17);
        auVar43 = vpunpcklwd_avx2(auVar11,auVar8);
        auVar44 = vpaddd_avx2(auVar44,auVar43);
        auVar43 = vpunpcklwd_avx2(auVar12,auVar9);
        auVar43 = vpaddd_avx2(auVar43,auVar46);
        auVar51 = vpunpcklwd_avx2(auVar18,auVar10);
        auVar51 = vpaddd_avx2(auVar51,auVar48);
        auVar53 = vpunpcklwd_avx2(auVar13,auVar17);
        auVar53 = vpaddd_avx2(auVar53,local_98);
        auVar8 = vpunpckhwd_avx2(auVar11,auVar8);
        auVar44 = vpaddd_avx2(auVar44,auVar8);
        auVar45 = ZEXT3264(auVar44);
        auVar44 = vpunpckhwd_avx2(auVar12,auVar9);
        auVar44 = vpaddd_avx2(auVar43,auVar44);
        auVar47 = ZEXT3264(auVar44);
        auVar44 = vpunpckhwd_avx2(auVar18,auVar10);
        auVar44 = vpaddd_avx2(auVar51,auVar44);
        auVar49 = ZEXT3264(auVar44);
        auVar44 = vpunpckhwd_avx2(auVar13,auVar17);
        local_98 = vpaddd_avx2(auVar53,auVar44);
        lVar38 = lVar38 + 0x20;
        local_78 = auVar48;
        local_58 = auVar46;
      }
      auVar11 = vpunpckldq_avx2(auVar53,auVar51);
      auVar12 = vpunpckldq_avx2(auVar43,local_b8);
      auVar8 = vpunpckhdq_avx2(auVar53,auVar51);
      auVar9 = vpunpckhdq_avx2(auVar43,local_b8);
      auVar18 = vpunpckldq_avx2(auVar44,auVar46);
      auVar13 = vpunpckldq_avx2(auVar48,local_98);
      auVar17 = vpunpckhdq_avx2(auVar44,auVar46);
      auVar10 = vpunpckhdq_avx2(auVar48,local_98);
      auVar48 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
      auVar44 = vpermd_avx2(auVar48,auVar12);
      auVar43 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
      auVar46 = vpermd_avx2(auVar43,auVar11);
      auVar44 = vpblendd_avx2(auVar46,auVar44,0xcc);
      auVar51 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
      auVar46 = vpermd_avx2(auVar51,auVar12);
      auVar53 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
      auVar11 = vpermd_avx2(auVar53,auVar11);
      auVar46 = vpblendd_avx2(auVar11,auVar46,0xcc);
      auVar44 = vpaddd_avx2(auVar44,auVar46);
      auVar46 = vpermd_avx2(auVar48,auVar9);
      auVar11 = vpermd_avx2(auVar43,auVar8);
      auVar46 = vpblendd_avx2(auVar11,auVar46,0xcc);
      auVar9 = vpermd_avx2(auVar51,auVar9);
      auVar8 = vpermd_avx2(auVar53,auVar8);
      auVar8 = vpblendd_avx2(auVar8,auVar9,0xcc);
      auVar46 = vpaddd_avx2(auVar46,auVar8);
      auVar44 = vpaddd_avx2(auVar44,auVar46);
      auVar46 = vpermd_avx2(auVar48,auVar13);
      auVar8 = vpermd_avx2(auVar43,auVar18);
      auVar46 = vpblendd_avx2(auVar8,auVar46,0xcc);
      auVar8 = vpermd_avx2(auVar51,auVar13);
      auVar9 = vpermd_avx2(auVar53,auVar18);
      auVar8 = vpblendd_avx2(auVar9,auVar8,0xcc);
      auVar46 = vpaddd_avx2(auVar8,auVar46);
      auVar48 = vpermd_avx2(auVar48,auVar10);
      auVar43 = vpermd_avx2(auVar43,auVar17);
      auVar48 = vpblendd_avx2(auVar43,auVar48,0xcc);
      auVar43 = vpermd_avx2(auVar51,auVar10);
      auVar51 = vpermd_avx2(auVar53,auVar17);
      auVar43 = vpblendd_avx2(auVar51,auVar43,0xcc);
      auVar48 = vpaddd_avx2(auVar48,auVar43);
      auVar46 = vpaddd_avx2(auVar46,auVar48);
      *pauVar39 = auVar44;
      pauVar39[1] = auVar46;
      pauVar39 = pauVar39 + 2;
      lVar41 = lVar41 + 1;
    }
    bVar32 = 0;
    for (; (int)((uint)uVar33 | 1) < (int)uVar2; uVar33 = (ulong)((uint)uVar33 + 2)) {
      lVar41 = kernel->cstep * uVar36 * kernel->elemsize;
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      lVar35 = 0;
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      auVar49 = ZEXT1664((undefined1  [16])0x0);
      auVar50 = ZEXT1664((undefined1  [16])0x0);
      uVar40 = uVar25;
      while( true ) {
        iVar21 = (int)uVar40;
        uVar40 = (ulong)(iVar21 - 1);
        auVar48 = auVar49._0_32_;
        auVar43 = auVar50._0_32_;
        auVar44 = auVar45._0_32_;
        auVar46 = auVar47._0_32_;
        if (iVar21 == 0) break;
        auVar51 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                  (local_108._0_8_ +
                                  lVar35 + local_c8 * local_108._16_8_ *
                                           (ulong)((bVar32 & 1) + ((uint)(uVar33 >> 2) & 0x3fffffff)
                                                  )));
        auVar53 = vpmovsxbw_avx2(*(undefined1 (*) [16])((long)kernel->data + lVar35 * 2 + lVar41));
        auVar8 = vpmovsxbw_avx2(*(undefined1 (*) [16])
                                 ((long)kernel->data + lVar35 * 2 + lVar41 + 0x10));
        auVar17 = vpmullw_avx2(auVar53,auVar51);
        auVar9 = vpmulhw_avx2(auVar51,auVar53);
        auVar18 = vpermq_avx2(auVar51,0x4e);
        auVar10 = vpmullw_avx2(auVar18,auVar53);
        auVar53 = vpmulhw_avx2(auVar18,auVar53);
        auVar11 = vpmullw_avx2(auVar8,auVar51);
        auVar51 = vpmulhw_avx2(auVar51,auVar8);
        auVar12 = vpmullw_avx2(auVar18,auVar8);
        auVar8 = vpmulhw_avx2(auVar18,auVar8);
        auVar18 = vpunpcklwd_avx2(auVar17,auVar9);
        auVar43 = vpaddd_avx2(auVar18,auVar43);
        auVar18 = vpunpcklwd_avx2(auVar10,auVar53);
        auVar48 = vpaddd_avx2(auVar18,auVar48);
        auVar18 = vpunpcklwd_avx2(auVar11,auVar51);
        auVar46 = vpaddd_avx2(auVar18,auVar46);
        auVar18 = vpunpcklwd_avx2(auVar12,auVar8);
        auVar44 = vpaddd_avx2(auVar18,auVar44);
        auVar9 = vpunpckhwd_avx2(auVar17,auVar9);
        auVar43 = vpaddd_avx2(auVar43,auVar9);
        auVar50 = ZEXT3264(auVar43);
        auVar43 = vpunpckhwd_avx2(auVar10,auVar53);
        auVar48 = vpaddd_avx2(auVar48,auVar43);
        auVar49 = ZEXT3264(auVar48);
        auVar48 = vpunpckhwd_avx2(auVar11,auVar51);
        auVar46 = vpaddd_avx2(auVar46,auVar48);
        auVar47 = ZEXT3264(auVar46);
        auVar46 = vpunpckhwd_avx2(auVar12,auVar8);
        auVar44 = vpaddd_avx2(auVar44,auVar46);
        auVar45 = ZEXT3264(auVar44);
        lVar35 = lVar35 + 0x10;
      }
      auVar9 = vpunpckldq_avx2(auVar43,auVar48);
      auVar51 = vpunpckldq_avx2(auVar46,auVar44);
      auVar53 = vpunpckhdq_avx2(auVar43,auVar48);
      auVar8 = vpunpckhdq_avx2(auVar46,auVar44);
      auVar46 = vpmovsxbd_avx2(ZEXT816(0x603000007020000));
      auVar44 = vpermd_avx2(auVar46,auVar51);
      auVar48 = vpmovsxbd_avx2(ZEXT816(0x60300000702));
      auVar43 = vpermd_avx2(auVar48,auVar9);
      auVar44 = vpblendd_avx2(auVar43,auVar44,0xcc);
      auVar43 = vpmovsxbd_avx2(ZEXT816(0x401000005000000));
      auVar17 = vpermd_avx2(auVar43,auVar51);
      auVar51 = vpmovsxbd_avx2(ZEXT816(0x40100000500));
      auVar9 = vpermd_avx2(auVar51,auVar9);
      auVar9 = vpblendd_avx2(auVar9,auVar17,0xcc);
      auVar44 = vpaddd_avx2(auVar9,auVar44);
      auVar46 = vpermd_avx2(auVar46,auVar8);
      auVar48 = vpermd_avx2(auVar48,auVar53);
      auVar46 = vpblendd_avx2(auVar48,auVar46,0xcc);
      auVar48 = vpermd_avx2(auVar43,auVar8);
      auVar43 = vpermd_avx2(auVar51,auVar53);
      auVar48 = vpblendd_avx2(auVar43,auVar48,0xcc);
      auVar46 = vpaddd_avx2(auVar46,auVar48);
      auVar44 = vpaddd_avx2(auVar44,auVar46);
      *pauVar39 = auVar44;
      pauVar39 = pauVar39 + 1;
      bVar32 = bVar32 + 1;
    }
    while( true ) {
      uVar24 = (uint)uVar33;
      if ((int)uVar2 <= (int)uVar24) break;
      pauVar22 = (undefined1 (*) [16])
                 (kernel->cstep * uVar36 * kernel->elemsize + (long)kernel->data);
      auVar45 = ZEXT1664((undefined1  [16])0x0);
      auVar47 = ZEXT1664((undefined1  [16])0x0);
      for (lVar41 = 0; (int)uVar25 != (int)lVar41; lVar41 = lVar41 + 1) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(local_108._0_8_ +
                                 lVar41 * 8 +
                                 local_c8 * local_108._16_8_ *
                                 (ulong)((uVar24 & 1) + ((uint)(uVar33 >> 2) & 0x3fffffff) +
                                        (uint)((uVar24 >> 1 & 1) != 0)));
        auVar1 = vpmovsxbw_avx(auVar1);
        auVar44 = vpmovsxbw_avx2(*pauVar22);
        auVar46 = vpmovsxbw_avx2(pauVar22[1]);
        auVar43._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
        auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
        auVar51 = vpmullw_avx2(auVar43,auVar44);
        auVar48 = vpmulhw_avx2(auVar43,auVar44);
        auVar53 = vpmullw_avx2(auVar43,auVar46);
        auVar43 = vpmulhw_avx2(auVar43,auVar46);
        auVar44 = vpunpcklwd_avx2(auVar51,auVar48);
        auVar44 = vpaddd_avx2(auVar45._0_32_,auVar44);
        auVar46 = vpunpcklwd_avx2(auVar53,auVar43);
        auVar46 = vpaddd_avx2(auVar47._0_32_,auVar46);
        auVar48 = vpunpckhwd_avx2(auVar51,auVar48);
        auVar44 = vpaddd_avx2(auVar44,auVar48);
        auVar45 = ZEXT3264(auVar44);
        auVar44 = vpunpckhwd_avx2(auVar53,auVar43);
        auVar44 = vpaddd_avx2(auVar46,auVar44);
        auVar47 = ZEXT3264(auVar44);
        pauVar22 = pauVar22 + 2;
      }
      auVar1 = vpunpckldq_avx(auVar45._0_16_,auVar45._16_16_);
      auVar6 = vpunpckldq_avx(auVar47._0_16_,auVar47._16_16_);
      auVar4 = vpunpckhdq_avx(auVar45._0_16_,auVar45._16_16_);
      auVar5 = vpunpckhdq_avx(auVar47._0_16_,auVar47._16_16_);
      auVar7 = vpunpcklqdq_avx(auVar1,auVar6);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar6);
      auVar1 = vpaddd_avx(auVar7,auVar1);
      auVar6 = vpunpcklqdq_avx(auVar4,auVar5);
      auVar4 = vpunpckhqdq_avx(auVar4,auVar5);
      auVar4 = vpaddd_avx(auVar4,auVar6);
      auVar1 = vpaddd_avx(auVar1,auVar4);
      *(undefined1 (*) [16])*pauVar39 = auVar1;
      pauVar39 = (undefined1 (*) [32])(*pauVar39 + 0x10);
      uVar33 = (ulong)(uVar24 + 1);
    }
  }
  piVar19 = (int *)CONCAT44(local_108._12_4_,local_108._8_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if ((Allocator *)local_108._32_8_ == (Allocator *)0x0) {
        free((void *)local_108._0_8_);
      }
      else {
        (*(*(_func_int ***)local_108._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}